

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* util::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,string *in,char delim)

{
  istream *piVar1;
  string item;
  istringstream ss;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)in,_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&item,delim);
    if (((&piVar1->field_0x20)[(long)piVar1->_vptr_basic_istream[-3]] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&item);
  }
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(std::string in, char delim) {
  std::vector<std::string> items;
  std::istringstream ss(in);
  std::string item;
  while (std::getline(ss, item, delim)) {
    items.push_back(item);
  }
  return items;
}